

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  bool bVar2;
  BinaryOp BVar3;
  PassOptions *pPVar4;
  Module *pMVar5;
  EffectAnalyzer local_360;
  Binary *local_1f0;
  Binary *inner_1;
  Binary *local_1e0;
  Binary *local_1d8;
  Binary *local_1d0;
  Binary *local_1c8;
  Binary *local_1c0;
  Binary *local_1b8;
  EffectAnalyzer local_1a0;
  Binary *local_30;
  Binary *inner;
  Type type;
  Binary *outer_local;
  OptimizeInstructions *this_local;
  
  inner = (Binary *)
          (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  type.id = (uintptr_t)outer;
  bVar2 = wasm::Type::isInteger((Type *)&inner);
  if (bVar2) {
    local_30 = Expression::dynCast<wasm::Binary>(*(Expression **)(type.id + 0x20));
    if ((local_30 != (Binary *)0x0) &&
       (*(int *)(type.id + 0x10) ==
        *(int *)&((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->op)->super_Expression))
    {
      pPVar4 = Pass::getPassOptions((Pass *)this);
      pMVar5 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      EffectAnalyzer::EffectAnalyzer(&local_1a0,pPVar4,pMVar5,*(Expression **)(type.id + 0x18));
      bVar2 = EffectAnalyzer::hasSideEffects(&local_1a0);
      EffectAnalyzer::~EffectAnalyzer(&local_1a0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar2 = ExpressionAnalyzer::equal
                          (*(Expression **)
                            &((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->left)->
                             super_Expression,*(Expression **)(type.id + 0x18));
        if (bVar2) {
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1b8 = inner;
          BVar3 = Abstract::getBinary((Type)inner,Sub);
          if (BVar1 == BVar3) {
LAB_018ef6c9:
            return *(Expression **)
                    &((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->right)->
                     super_Expression;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1c0 = inner;
          BVar3 = Abstract::getBinary((Type)inner,Xor);
          if (BVar1 == BVar3) goto LAB_018ef6c9;
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1c8 = inner;
          BVar3 = Abstract::getBinary((Type)inner,And);
          if (BVar1 == BVar3) {
            return (Expression *)local_30;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1d0 = inner;
          BVar3 = Abstract::getBinary((Type)inner,Or);
          if (BVar1 == BVar3) {
            return (Expression *)local_30;
          }
        }
        bVar2 = ExpressionAnalyzer::equal
                          (*(Expression **)
                            &((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->right)->
                             super_Expression,*(Expression **)(type.id + 0x18));
        if ((bVar2) &&
           (bVar2 = canReorder(this,*(Expression **)(type.id + 0x18),
                               *(Expression **)
                                &((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->left)->
                                 super_Expression), bVar2)) {
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1d8 = inner;
          BVar3 = Abstract::getBinary((Type)inner,Xor);
          if (BVar1 == BVar3) {
            return *(Expression **)
                    &((SpecificExpression<(wasm::Expression::Id)16> *)&local_30->left)->
                     super_Expression;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          local_1e0 = inner;
          BVar3 = Abstract::getBinary((Type)inner,And);
          if (BVar1 == BVar3) {
            return (Expression *)local_30;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          inner_1 = inner;
          BVar3 = Abstract::getBinary((Type)inner,Or);
          if (BVar1 == BVar3) {
            return (Expression *)local_30;
          }
        }
      }
    }
    local_1f0 = Expression::dynCast<wasm::Binary>(*(Expression **)(type.id + 0x18));
    if ((local_1f0 != (Binary *)0x0) &&
       (*(int *)(type.id + 0x10) ==
        *(int *)&((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->op)->super_Expression)
       ) {
      pPVar4 = Pass::getPassOptions((Pass *)this);
      pMVar5 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      EffectAnalyzer::EffectAnalyzer(&local_360,pPVar4,pMVar5,*(Expression **)(type.id + 0x20));
      bVar2 = EffectAnalyzer::hasSideEffects(&local_360);
      EffectAnalyzer::~EffectAnalyzer(&local_360);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar2 = ExpressionAnalyzer::equal
                          (*(Expression **)
                            &((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->right)->
                             super_Expression,*(Expression **)(type.id + 0x20));
        if (bVar2) {
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          BVar3 = Abstract::getBinary((Type)inner,Xor);
          if (BVar1 == BVar3) {
            return *(Expression **)
                    &((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->left)->
                     super_Expression;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          BVar3 = Abstract::getBinary((Type)inner,RemS);
          if ((((BVar1 == BVar3) ||
               (BVar1 = *(BinaryOp *)(type.id + 0x10), BVar3 = Abstract::getBinary((Type)inner,RemU)
               , BVar1 == BVar3)) ||
              (BVar1 = *(BinaryOp *)(type.id + 0x10), BVar3 = Abstract::getBinary((Type)inner,And),
              BVar1 == BVar3)) ||
             (BVar1 = *(BinaryOp *)(type.id + 0x10), BVar3 = Abstract::getBinary((Type)inner,Or),
             BVar1 == BVar3)) {
            return (Expression *)local_1f0;
          }
        }
        bVar2 = ExpressionAnalyzer::equal
                          (*(Expression **)
                            &((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->left)->
                             super_Expression,*(Expression **)(type.id + 0x20));
        if ((bVar2) &&
           (bVar2 = canReorder(this,*(Expression **)
                                     &((SpecificExpression<(wasm::Expression::Id)16> *)
                                      &local_1f0->left)->super_Expression,
                               *(Expression **)
                                &((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->right)
                                 ->super_Expression), bVar2)) {
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          BVar3 = Abstract::getBinary((Type)inner,Xor);
          if (BVar1 == BVar3) {
            return *(Expression **)
                    &((SpecificExpression<(wasm::Expression::Id)16> *)&local_1f0->right)->
                     super_Expression;
          }
          BVar1 = *(BinaryOp *)(type.id + 0x10);
          BVar3 = Abstract::getBinary((Type)inner,And);
          if ((BVar1 == BVar3) ||
             (BVar1 = *(BinaryOp *)(type.id + 0x10), BVar3 = Abstract::getBinary((Type)inner,Or),
             BVar1 == BVar3)) {
            return (Expression *)local_1f0;
          }
        }
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }